

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QToolBarAreaLayout::itemAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  QToolBarAreaLayoutLine *pQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  lVar4 = 0;
  do {
    lVar2 = this->docks[lVar4].lines.d.size;
    if (lVar2 != 0) {
      pQVar3 = this->docks[lVar4].lines.d.ptr;
      lVar5 = 0;
      do {
        lVar7 = pQVar3[lVar5].toolBarItems.d.size;
        if (lVar7 != 0) {
          iVar1 = *x;
          iVar8 = 0;
          lVar6 = 0;
          do {
            if (iVar1 - index == iVar8) {
              *x = (iVar1 - iVar8) + 1;
              return *(QLayoutItem **)
                      ((long)&(pQVar3[lVar5].toolBarItems.d.ptr)->widgetItem + lVar6);
            }
            lVar6 = lVar6 + 0x18;
            iVar8 = iVar8 + -1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
          *x = iVar1 - iVar8;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar2);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index)
                    return line.toolBarItems.at(k).widgetItem;
            }
        }
    }

    return nullptr;
}